

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall
txpackage_tests::noncontextual_package_tests::test_method(noncontextual_package_tests *this)

{
  long lVar1;
  element_type *peVar2;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  readonly_property65 rVar6;
  bool bVar7;
  readonly_property<bool> rVar8;
  long lVar9;
  iterator pvVar10;
  iterator pvVar11;
  Package *pPVar12;
  CKey *pCVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string file;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  const_string file_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  const_string file_07;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_08;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_09;
  const_string file_15;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  const_string file_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_11;
  const_string file_17;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_12;
  const_string file_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_13;
  const_string file_19;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_14;
  const_string file_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_15;
  const_string file_21;
  const_string file_22;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  check_type cVar16;
  char *pcVar14;
  undefined4 in_stack_fffffffffffff7bc;
  undefined4 uVar15;
  TestChain100Setup *this_00;
  CKey *other;
  undefined8 in_stack_fffffffffffff7d0;
  CAmount in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  CKey local_560;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_550;
  char *local_540;
  char *local_538;
  assertion_result local_530;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 local_4b0 [23];
  allocator_type local_499;
  CTransactionRef tx_parent_1;
  shared_count sStack_488;
  allocator_type local_479;
  pointer local_478;
  pointer local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  CTransactionRef tx_child;
  CKey local_328;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_318;
  CTransactionRef tx_parent;
  CKey local_2f8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  CKey placeholder_key_2;
  CKey placeholder_key;
  Package package;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_298;
  CMutableTransaction mtx_child_1;
  CMutableTransaction mtx_parent;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  PackageValidationState state;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_180;
  CTransactionRef tx_child_1;
  undefined1 local_148 [16];
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> _Stack_138;
  CTransactionRef tx_parent_also_child;
  undefined1 local_110 [8];
  element_type *local_108;
  shared_count sStack_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_f0;
  CMutableTransaction mtx_child;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_98;
  CScript spk2;
  CScript spk;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&placeholder_key,0));
  CKey::GetPubKey((CPubKey *)&mtx_parent,&placeholder_key);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&mtx_parent);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       CONCAT44(state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                _M_string_length._4_4_,
                mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  GetScriptForDestination(&spk,(CTxDestination *)&state);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&state);
  GenerateRandomKey(SUB81(&placeholder_key_2,0));
  CKey::GetPubKey((CPubKey *)&mtx_parent,&placeholder_key_2);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&mtx_parent);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       CONCAT44(state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                _M_string_length._4_4_,
                mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  GetScriptForDestination(&spk2,(CTxDestination *)&state);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&state);
  this_00 = (TestChain100Setup *)this;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e8,
             &((((TestChain100Setup *)this)->m_coinbase_txns).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  other = &((TestChain100Setup *)this)->coinbaseKey;
  CKey::CKey(&local_2f8,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_98,&spk.super_CScriptBase);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_98;
  auVar3._4_8_ = this_00;
  auVar3._0_4_ = in_stack_fffffffffffff7bc;
  auVar3._12_8_ = other;
  auVar3._20_8_ = in_stack_fffffffffffff7d0;
  auVar3._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_2e8;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,this_00,input_transaction,0,(int)&local_2f8,input_signing_key,
             (CScript)(auVar3 << 0x20),in_stack_fffffffffffff7d8,SUB81(in_stack_fffffffffffff7e0,0))
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_98);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_2f8.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_318,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_328,&placeholder_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_f0,&spk2.super_CScriptBase);
  _cVar16 = 4800000000;
  pvVar10 = (iterator)0x65;
  pCVar13 = &local_328;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_00._0_8_ = &local_f0;
  auVar4._4_8_ = this_00;
  auVar4._0_4_ = in_stack_fffffffffffff7bc;
  auVar4._12_8_ = other;
  auVar4._20_8_ = in_stack_fffffffffffff7d0;
  auVar4._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_318;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,this_00,input_transaction_00,0x65,(int)pCVar13,input_signing_key_00,
             (CScript)(auVar4 << 0x20),in_stack_fffffffffffff7d8,SUB81(in_stack_fffffffffffff7e0,0))
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_f0);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_328.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
         _M_allocated_capacity & 0xffffffffffffff00;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = &pCVar13->fCompressed;
  msg.m_begin = pvVar10;
  file.m_end = (iterator)0x115;
  file.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_358,msg);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_child_1,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&mtx_child_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l,(allocator_type *)&tx_parent_1);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsWellFormedPackage((Package *)local_148,&state,true);
  local_110[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "IsWellFormedPackage({tx_parent, tx_child}, state, true)";
  local_530.m_message.px = (element_type *)0xc62a3f;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_360 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&package,1,0,WARN,_cVar16,
             (size_t)&local_368,0x115);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  file_00.m_end = (iterator)0x116;
  file_00.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_388,
             msg_00);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_child_1,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&mtx_child_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l_00,(allocator_type *)&tx_parent_1);
  bVar7 = IsWellFormedPackage((Package *)local_148,&state,true);
  local_110[0] = (class_property<bool>)(class_property<bool>)!bVar7;
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "!IsWellFormedPackage({tx_child, tx_parent}, state, true)";
  local_530.m_message.px = (element_type *)0xc62a78;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_390 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&package,1,0,WARN,_cVar16,
             (size_t)&local_398,0x116);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x117;
  file_01.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3b8,
             msg_01);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3c0 = "";
  pPVar12 = &package;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         state.super_ValidationState<PackageValidationResult>.m_result);
  local_110._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&mtx_child_1,&local_3c8,0x117,1,2,pPVar12,0xc6412d,(assertion_result *)local_110,
             0xc62342);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pPVar12;
  msg_02.m_begin = pvVar10;
  file_02.m_end = (iterator)0x118;
  file_02.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3e8,
             msg_02);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3f0 = "";
  std::__cxx11::string::string
            ((string *)&package,
             &state.super_ValidationState<PackageValidationResult>.m_reject_reason);
  uVar15 = 0;
  pcVar14 = "package-not-sorted";
  pvVar10 = (iterator)0x2;
  pPVar12 = &package;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (&mtx_child_1,&local_3f8,0x118,1,2,pPVar12,0xc6303d,"package-not-sorted",0xc62a8c);
  std::__cxx11::string::~string((string *)&package);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pPVar12;
  msg_03.m_begin = pvVar10;
  file_03.m_end = (iterator)0x119;
  file_03.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_418,
             msg_03);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_child_1,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&mtx_child_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l_01,(allocator_type *)&tx_parent_1);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsChildWithParents((Package *)local_148);
  local_110[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "IsChildWithParents({tx_parent, tx_child})";
  local_530.m_message.px = (element_type *)0xc62aca;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_420 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&package,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_428,0x119);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  file_04.m_end = (iterator)0x11a;
  file_04.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_448,
             msg_04);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_child_1,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&mtx_child_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l_02,(allocator_type *)&tx_parent_1);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsChildWithParentsTree((Package *)local_148);
  local_110[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_530._0_8_ = "IsChildWithParentsTree({tx_parent, tx_child})";
  local_530.m_message.px = (element_type *)0xc62af8;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&package,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_458,0x11a);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_460 = "";
  local_478 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  local_470 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  file_05.m_end = (iterator)0x11b;
  file_05.m_begin = (iterator)&local_468;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
             msg_05);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 1;
  __l_03._M_array =
       (iterator)
       &tx_parent_also_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_03,&local_479);
  GetPackageHash((uint256 *)&mtx_child_1,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_530);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_04._M_len = 1;
  __l_04._M_array =
       (iterator)&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx_parent_1,__l_04,&local_499);
  GetPackageHash((uint256 *)&package,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&tx_parent_1);
  bVar7 = ::operator!=((base_blob<256U> *)&mtx_child_1,(base_blob<256U> *)&package);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  local_4b0._0_8_ = "GetPackageHash({tx_parent}) != GetPackageHash({tx_child})";
  local_4b0._8_8_ = "";
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4b8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_4c0,0x11b);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx_parent_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  file_06.m_end = (iterator)0x11c;
  file_06.m_begin = (iterator)&local_4d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4e0,
             msg_06);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx_parent_1,__l_05,&local_479);
  GetPackageHash((uint256 *)&mtx_child_1,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&tx_parent_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_06._M_len = 1;
  __l_06._M_array =
       (iterator)&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx_parent_also_child,__l_06,&local_499);
  GetPackageHash((uint256 *)local_110,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&tx_parent_also_child);
  bVar7 = ::operator!=((base_blob<256U> *)&mtx_child_1,(base_blob<256U> *)local_110);
  local_530.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar7;
  local_530.m_message.px = (element_type *)0x0;
  local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4b0._0_8_ = "GetPackageHash({tx_child, tx_child}) != GetPackageHash({tx_child})";
  local_4b0._8_8_ = "";
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  local_148._0_8_ = &PTR__lazy_ostream_0113a070;
  _Stack_138._M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4e8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  _Stack_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_530,(lazy_ostream *)local_148,1,0,WARN,(check_type)pcVar14,(size_t)&local_4f0,
             0x11c);
  boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx_parent_also_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx_parent_1);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  file_07.m_end = (iterator)0x11d;
  file_07.m_begin = (iterator)&local_500;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_510,
             msg_07);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx_parent_also_child,__l_07,&local_479);
  GetPackageHash((uint256 *)&mtx_child_1,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&tx_parent_also_child);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_148,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_138,
             &tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_148;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx_child_1,__l_08,&local_499);
  GetPackageHash((uint256 *)local_110,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&tx_child_1);
  tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       ::operator!=((base_blob<256U> *)&mtx_child_1,(base_blob<256U> *)local_110);
  tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_488.pi_ = (sp_counted_base *)0x0;
  local_4b0._0_8_ = "GetPackageHash({tx_child, tx_parent}) != GetPackageHash({tx_child, tx_child})";
  local_4b0._8_8_ = "";
  local_530.m_message.px = (element_type *)((ulong)local_530.m_message.px & 0xffffffffffffff00);
  local_530._0_8_ = &PTR__lazy_ostream_0113a070;
  local_530.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_538 = "";
  pvVar10 = &DAT_00000001;
  pCVar13 = (CKey *)0x0;
  local_518 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_parent_1,(lazy_ostream *)&local_530,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_540,0x11d);
  boost::detail::shared_count::~shared_count(&sStack_488);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx_child_1);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx_parent_also_child);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state.super_ValidationState<PackageValidationResult>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CMutableTransaction::CMutableTransaction(&mtx_child);
  for (lVar9 = 0x10; lVar9 != 400; lVar9 = lVar9 + 0x10) {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_550,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_00->m_coinbase_txns).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar9));
    CKey::CKey(&local_560,other);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_180,&spk.super_CScriptBase);
    pcVar14 = (char *)0x11e1a3000;
    pvVar10 = (iterator)0x0;
    input_signing_key_01.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )0x11e1a3000;
    input_signing_key_01._0_8_ = &local_180;
    auVar5._4_8_ = this_00;
    auVar5._0_4_ = uVar15;
    auVar5._12_8_ = other;
    auVar5._20_8_ = in_stack_fffffffffffff7d0;
    auVar5._28_4_ = 0;
    input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_550;
    pCVar13 = &local_560;
    TestChain100Setup::CreateValidMempoolTransaction
              ((CMutableTransaction *)&state,this_00,input_transaction_01,0,(int)&local_560,
               input_signing_key_01,(CScript)(auVar5 << 0x20),in_stack_fffffffffffff7d8,
               SUB81(in_stack_fffffffffffff7e0,0));
    std::make_shared<CTransaction_const,CMutableTransaction>(&mtx_parent);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&state);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_180);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&local_560.keydata);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550._M_refcount);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package,(shared_ptr<const_CTransaction> *)&mtx_parent);
    state.super_ValidationState<PackageValidationResult>._0_8_ =
         *(undefined8 *)
          ((long)&((mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union + 0x11);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         *(pointer *)
          ((long)&((mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union + 0x19);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         *(size_type *)
          ((long)&(mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start)->nSequence + 1);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity =
         *(size_type *)
          ((long)&((mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptWitness).stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ = 0;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
              (&mtx_child.vin,(COutPoint *)&state);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  state.super_ValidationState<PackageValidationResult>.m_mode = 0x18244f00;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_POLICY;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_child.vout,(long *)&state,&spk2);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = &pCVar13->fCompressed;
  msg_08.m_begin = pvVar10;
  file_08.m_end = (iterator)0x12d;
  file_08.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_580,
             msg_08);
  bVar7 = IsChildWithParents(&package);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar7);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_124d589;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc62be0;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_0113a070;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = (size_type)&mtx_child_1;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_588 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent,(lazy_ostream *)&state,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_590,0x12d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  FastRandomContext::FastRandomContext((FastRandomContext *)&state,false);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,FastRandomContext&>
            ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              )package.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              )package.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(FastRandomContext *)&state);
  std::make_shared<CTransaction_const,CMutableTransaction&>(&mtx_parent);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&package,(shared_ptr<const_CTransaction> *)&mtx_parent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&mtx_parent.vout;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_218;
  mtx_parent.version = 0;
  mtx_parent.nLockTime = 0;
  local_218._M_local_buf[0] = '\0';
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  file_09.m_end = (iterator)0x135;
  file_09.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5b0,
             msg_09);
  rVar8.super_class_property<bool>.value =
       (class_property<bool>)
       IsWellFormedPackage(&package,(PackageValidationState *)&mtx_parent,true);
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "IsWellFormedPackage(package, state, true)";
  local_148._8_8_ = "";
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148;
  local_110[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&mtx_child_1,1,0,WARN,(check_type)pcVar14
             ,(size_t)&local_5c0,0x135);
  boost::detail::shared_count::~shared_count(&sStack_100);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  file_10.m_end = (iterator)0x136;
  file_10.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5e0,
             msg_10);
  local_110[0] = (class_property<bool>)IsChildWithParents(&package);
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "IsChildWithParents(package)";
  local_148._8_8_ = "";
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&mtx_child_1,1,0,WARN,(check_type)pcVar14
             ,(size_t)&local_5f0,0x136);
  boost::detail::shared_count::~shared_count(&sStack_100);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar10;
  file_11.m_end = (iterator)0x137;
  file_11.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_610,
             msg_11);
  local_110[0] = (class_property<bool>)IsChildWithParentsTree(&package);
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "IsChildWithParentsTree(package)";
  local_148._8_8_ = "";
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_618 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&mtx_child_1,1,0,WARN,(check_type)pcVar14
             ,(size_t)&local_620,0x137);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::erase(&package,(const_iterator)
                   package.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar10;
  file_12.m_end = (iterator)0x13a;
  file_12.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_640,
             msg_12);
  local_110[0] = (class_property<bool>)IsChildWithParents(&package);
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "IsChildWithParents(package)";
  local_148._8_8_ = "";
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_648 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&mtx_child_1,1,0,WARN,(check_type)pcVar14
             ,(size_t)&local_650,0x13a);
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::insert(&package,(const_iterator)
                    package.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
           (this_00->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar10;
  file_13.m_end = (iterator)0x13e;
  file_13.m_begin = (iterator)&local_660;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_670,
             msg_13);
  bVar7 = IsChildWithParents(&package);
  local_110[0] = (class_property<bool>)(class_property<bool>)!bVar7;
  local_108 = (element_type *)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ = "!IsChildWithParents(package)";
  local_148._8_8_ = "";
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_child_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_678 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  mtx_child_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&mtx_child_1,1,0,WARN,(check_type)pcVar14
             ,(size_t)&local_680,0x13e);
  boost::detail::shared_count::~shared_count(&sStack_100);
  ValidationState<PackageValidationResult>::~ValidationState
            ((ValidationState<PackageValidationResult> *)&mtx_parent);
  ChaCha20::~ChaCha20((ChaCha20 *)
                      &state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package);
  CMutableTransaction::CMutableTransaction(&mtx_parent);
  peVar2 = (((this_00->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)&(peVar2->hash).m_wrapped;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       *(pointer *)((long)&peVar2->hash + 8);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       *(size_type *)((long)&peVar2->hash + 0x10);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = *(undefined8 *)((long)&peVar2->hash + 0x18);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_parent.vin,(COutPoint *)&state);
  state.super_ValidationState<PackageValidationResult>.m_mode = 2000000000;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_parent.vout,(long *)&state,&spk);
  state.super_ValidationState<PackageValidationResult>.m_mode = 2000000000;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_parent.vout,(long *)&state,&spk2);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent_1);
  CMutableTransaction::CMutableTransaction(&mtx_child);
  lVar9 = CONCAT71(tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._1_7_,
                   tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._0_1_);
  state.super_ValidationState<PackageValidationResult>._0_8_ = *(undefined8 *)(lVar9 + 0x39);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       *(pointer *)(lVar9 + 0x41);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       *(size_type *)(lVar9 + 0x49);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = *(size_type *)(lVar9 + 0x51);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_child.vin,(COutPoint *)&state);
  state.super_ValidationState<PackageValidationResult>.m_mode = 2000000000;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_child.vout,(long *)&state,&spk);
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)&tx_parent_also_child);
  CMutableTransaction::CMutableTransaction(&mtx_child_1);
  lVar9 = CONCAT71(tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._1_7_,
                   tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._0_1_);
  state.super_ValidationState<PackageValidationResult>._0_8_ = *(undefined8 *)(lVar9 + 0x39);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       *(pointer *)(lVar9 + 0x41);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       *(size_type *)(lVar9 + 0x49);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = *(size_type *)(lVar9 + 0x51);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_child_1.vin,(COutPoint *)&state);
  state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)
        ((tx_parent_also_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       *(pointer *)
        (((tx_parent_also_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       *(size_type *)
        (((tx_parent_also_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = *(undefined8 *)
          (((tx_parent_also_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_child_1.vin,(COutPoint *)&state);
  state.super_ValidationState<PackageValidationResult>.m_mode = 3900000000;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_child_1.vout,(long *)&state,&spk);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child_1);
  state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
         _M_allocated_capacity & 0xffffffffffffff00;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar11;
  msg_14.m_begin = pvVar10;
  file_14.m_end = (iterator)0x155;
  file_14.m_begin = (iterator)&local_690;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6a0,
             msg_14);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_09,(allocator_type *)&tx_child);
  bVar7 = IsChildWithParents((Package *)&local_530);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d5b9;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62c60;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6a8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_6b0,0x155);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar10;
  file_15.m_end = (iterator)0x156;
  file_15.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6d0,
             msg_15);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_10,(allocator_type *)&tx_child);
  bVar7 = IsChildWithParents((Package *)&local_530);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d531;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62aca;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6d8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_6e0,0x156);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar10;
  file_16.m_end = (iterator)0x157;
  file_16.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_700,
             msg_16);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_11,(allocator_type *)&tx_child);
  bVar7 = IsChildWithParents((Package *)&local_530);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d5d3;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62ca0;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_708 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_710,0x157);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar10;
  file_17.m_end = (iterator)0x158;
  file_17.m_begin = (iterator)&local_720;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_730,
             msg_17);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_12,(allocator_type *)&tx_child);
  bVar7 = IsChildWithParentsTree((Package *)&local_530);
  local_148[0] = !bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d5ed;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62ce5;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_738 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_740,0x158);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar11;
  msg_18.m_begin = pvVar10;
  file_18.m_end = (iterator)0x15a;
  file_18.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_760,
             msg_18);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_13,(allocator_type *)&tx_child);
  bVar7 = IsChildWithParents((Package *)&local_530);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d607;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62d25;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_768 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_770,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar10;
  file_19.m_end = (iterator)0x15b;
  file_19.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_790,
             msg_19);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_14._M_len = 3;
  __l_14._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_14,(allocator_type *)&tx_child);
  bVar7 = IsWellFormedPackage((Package *)&local_530,&state,true);
  local_148[0] = bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d613;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62d73;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_798 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_7a0,0x15b);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar11;
  msg_20.m_begin = pvVar10;
  file_20.m_end = (iterator)0x15c;
  file_20.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_7c0,
             msg_20);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&package,
             &tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &package.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,
             &tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_15._M_len = 3;
  __l_15._M_array = (iterator)&package;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_530,__l_15,(allocator_type *)&tx_child);
  bVar7 = IsWellFormedPackage((Package *)&local_530,&state,true);
  local_148[0] = !bVar7;
  local_148._8_8_ = (element_type *)0x0;
  _Stack_138._M_ptr = (element_type *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_124d61f;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc62dc2;
  local_108 = (element_type *)((ulong)local_108 & 0xffffffffffffff00);
  local_110 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7c8 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_110,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_7d0,0x15c);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_530);
  lVar9 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&package.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -8);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar10;
  file_21.m_end = (iterator)0x15d;
  file_21.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_7f0,
             msg_21);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7f8 = "";
  pvVar10 = local_110;
  local_110._0_4_ = state.super_ValidationState<PackageValidationResult>.m_result;
  local_148._0_4_ = 1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&package,&local_800,0x15d,1,2,pvVar10,0xc6412d,(assertion_result *)local_148,0xc62342);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_808 = "";
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar11;
  file_22.m_end = (iterator)0x15e;
  file_22.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
             (size_t)&stack0xfffffffffffff7e0,msg_22);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)package.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  package.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  std::__cxx11::string::string
            ((string *)local_110,
             &state.super_ValidationState<PackageValidationResult>.m_reject_reason);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (&package,&stack0xfffffffffffff7d0,0x15e,1,2,local_110,0xc6303d,"package-not-sorted",
             0xc62a8c);
  std::__cxx11::string::~string((string *)local_110);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state.super_ValidationState<PackageValidationResult>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_also_child.
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&spk2.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&placeholder_key_2.keydata);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&spk.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&placeholder_key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(noncontextual_package_tests)
{
    // The signatures won't be verified so we can just use a placeholder
    CKey placeholder_key = GenerateRandomKey();
    CScript spk = GetScriptForDestination(PKHash(placeholder_key.GetPubKey()));
    CKey placeholder_key_2 = GenerateRandomKey();
    CScript spk2 = GetScriptForDestination(PKHash(placeholder_key_2.GetPubKey()));

    // Parent and Child Package
    {
        auto mtx_parent = CreateValidMempoolTransaction(m_coinbase_txns[0], 0, 0, coinbaseKey, spk,
                                                        CAmount(49 * COIN), /*submit=*/false);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        auto mtx_child = CreateValidMempoolTransaction(tx_parent, 0, 101, placeholder_key, spk2,
                                                       CAmount(48 * COIN), /*submit=*/false);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_child, tx_parent}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParentsTree({tx_parent, tx_child}));
        BOOST_CHECK(GetPackageHash({tx_parent}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_child}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_parent}) != GetPackageHash({tx_child, tx_child}));
    }

    // 24 Parents and 1 Child
    {
        Package package;
        CMutableTransaction child;
        for (int i{0}; i < 24; ++i) {
            auto parent = MakeTransactionRef(CreateValidMempoolTransaction(m_coinbase_txns[i + 1],
                                             0, 0, coinbaseKey, spk, CAmount(48 * COIN), false));
            package.emplace_back(parent);
            child.vin.emplace_back(COutPoint(parent->GetHash(), 0));
        }
        child.vout.emplace_back(47 * COIN, spk2);

        // The child must be in the package.
        BOOST_CHECK(!IsChildWithParents(package));

        // The parents can be in any order.
        FastRandomContext rng;
        std::shuffle(package.begin(), package.end(), rng);
        package.push_back(MakeTransactionRef(child));

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage(package, state, /*require_sorted=*/true));
        BOOST_CHECK(IsChildWithParents(package));
        BOOST_CHECK(IsChildWithParentsTree(package));

        package.erase(package.begin());
        BOOST_CHECK(IsChildWithParents(package));

        // The package cannot have unrelated transactions.
        package.insert(package.begin(), m_coinbase_txns[0]);
        BOOST_CHECK(!IsChildWithParents(package));
    }

    // 2 Parents and 1 Child where one parent depends on the other.
    {
        CMutableTransaction mtx_parent;
        mtx_parent.vin.emplace_back(COutPoint(m_coinbase_txns[0]->GetHash(), 0));
        mtx_parent.vout.emplace_back(20 * COIN, spk);
        mtx_parent.vout.emplace_back(20 * COIN, spk2);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        CMutableTransaction mtx_parent_also_child;
        mtx_parent_also_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 0));
        mtx_parent_also_child.vout.emplace_back(20 * COIN, spk);
        CTransactionRef tx_parent_also_child = MakeTransactionRef(mtx_parent_also_child);

        CMutableTransaction mtx_child;
        mtx_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 1));
        mtx_child.vin.emplace_back(COutPoint(tx_parent_also_child->GetHash(), 0));
        mtx_child.vout.emplace_back(39 * COIN, spk);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child, tx_child}));
        BOOST_CHECK(!IsChildWithParentsTree({tx_parent, tx_parent_also_child, tx_child}));
        // IsChildWithParents does not detect unsorted parents.
        BOOST_CHECK(IsChildWithParents({tx_parent_also_child, tx_parent, tx_child}));
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_parent_also_child, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_parent_also_child, tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
    }
}